

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd.c
# Opt level: O1

size_t ZSTD_compressBegin_advanced_internal
                 (ZSTD_CCtx *cctx,void *dict,size_t dictSize,ZSTD_dictContentType_e dictContentType,
                 ZSTD_dictTableLoadMethod_e dtlm,ZSTD_CDict *cdict,ZSTD_CCtx_params *params,
                 unsigned_long_long pledgedSrcSize)

{
  ulong uVar1;
  undefined4 in_R11D;
  int iVar2;
  undefined1 auVar3 [16];
  
  auVar3._0_4_ = -(uint)(0x7fffffe9 < (int)((params->cParams).windowLog - 0x20 ^ 0x80000000));
  auVar3._4_4_ = -(uint)(0x7fffffe6 < (int)((params->cParams).chainLog - 0x1f ^ 0x80000000));
  auVar3._8_4_ = -(uint)(0x7fffffe6 < (int)((params->cParams).hashLog - 0x1f ^ 0x80000000));
  auVar3._12_4_ = -(uint)(0x7fffffe1 < (int)((params->cParams).searchLog - 0x1f ^ 0x80000000));
  iVar2 = movmskps(in_R11D,auVar3);
  uVar1 = 0xffffffffffffffd6;
  if (((iVar2 == 0xf) && (0xfffffffa < (params->cParams).minMatch - 8)) &&
     ((params->cParams).targetLength < 0x20001)) {
    uVar1 = 0xffffffffffffffd6;
    if (0xfffffff6 < (params->cParams).strategy + ~ZSTD_btultra2) {
      uVar1 = 0;
    }
  }
  if (uVar1 < 0xffffffffffffff89) {
    uVar1 = ZSTD_compressBegin_internal
                      (cctx,dict,dictSize,dictContentType,dtlm,cdict,params,pledgedSrcSize,
                       ZSTDb_not_buffered);
  }
  return uVar1;
}

Assistant:

size_t ZSTD_compressBegin_advanced_internal(ZSTD_CCtx* cctx,
                                    const void* dict, size_t dictSize,
                                    ZSTD_dictContentType_e dictContentType,
                                    ZSTD_dictTableLoadMethod_e dtlm,
                                    const ZSTD_CDict* cdict,
                                    const ZSTD_CCtx_params* params,
                                    unsigned long long pledgedSrcSize)
{
    DEBUGLOG(4, "ZSTD_compressBegin_advanced_internal: wlog=%u", params->cParams.windowLog);
    /* compression parameters verification and optimization */
    FORWARD_IF_ERROR( ZSTD_checkCParams(params->cParams) , "");
    return ZSTD_compressBegin_internal(cctx,
                                       dict, dictSize, dictContentType, dtlm,
                                       cdict,
                                       params, pledgedSrcSize,
                                       ZSTDb_not_buffered);
}